

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_ReaderRegisterHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  CMConnection in_RDX;
  undefined8 in_RDI;
  _ReaderRegisterMsg *Msg;
  SstStream Stream;
  char *tmpstr;
  _ReaderRegisterMsg *Req;
  SstStream in_stack_ffffffffffffffd0;
  
  ps_register_thread_();
  if (_perfstubs_initialized == 1) {
    if (CP_ReaderRegisterHandler::timer == (void *)0x0) {
      in_stack_ffffffffffffffd0 =
           (SstStream)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                               ,"CP_ReaderRegisterHandler",0x9a2);
      CP_ReaderRegisterHandler::timer = (void *)ps_timer_create_(in_stack_ffffffffffffffd0);
      free(in_stack_ffffffffffffffd0);
    }
    ps_timer_start_(CP_ReaderRegisterHandler::timer);
  }
  Req = *(_ReaderRegisterMsg **)in_RDX;
  CMtake_buffer(in_RDI,in_RDX);
  queueReaderRegisterMsgAndNotify(in_stack_ffffffffffffffd0,Req,in_RDX);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_ReaderRegisterHandler::timer);
  }
  return;
}

Assistant:

void CP_ReaderRegisterHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                              attr_list attrs)
{
    PERFSTUBS_REGISTER_THREAD();
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    struct _ReaderRegisterMsg *Msg = (struct _ReaderRegisterMsg *)Msg_v;
    //    fprintf(stderr,
    //            "Received a reader registration message directed at writer
    //            %p\n",
    //            Msg->writer_file);
    //    fprintf(stderr, "A reader cohort of size %d is requesting to be
    //    added\n",
    //            Msg->ReaderCohortSize);
    //    for (int i = 0; i < Msg->ReaderCohortSize; i++) {
    //        fprintf(stderr, " rank %d CP contact info: %s, %d, %p\n", i,
    //                Msg->CP_ReaderInfo[i]->ContactInfo,
    //                Msg->CP_ReaderInfo[i]->target_stone,
    //                Msg->CP_ReaderInfo[i]->ReaderID);
    //    }
    Stream = Msg->WriterFile;

    //    printf("WRITER network handler PID is %lx, TID %lx in reader register
    //    "
    //           "handler\n",
    //           (long)getpid(), (long)gettid());
    /* arrange for this message data to stay around */
    CMtake_buffer(cm, Msg);

    queueReaderRegisterMsgAndNotify(Stream, Msg, conn);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}